

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexDeclaration
          (OgreBinarySerializer *this,VertexData *dest)

{
  uint16_t uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
    return;
  }
  do {
    uVar1 = ReadHeader(this,true);
    bVar3 = uVar1 != 0x5110;
    do {
      uVar2 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((bVar3) || ((uVar2 & 0xffffffff) == 0)) {
        if ((int)uVar2 == 0) {
          return;
        }
        RollbackHeader(this);
        return;
      }
      ReadGeometryVertexElement(this,dest);
      bVar3 = false;
    } while (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current);
  } while( true );
}

Assistant:

bool OgreBinarySerializer::AtEnd() const
{
    return (m_reader->GetRemainingSize() == 0);
}